

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_loclists.c
# Opt level: O0

int dwarf_get_loclist_offset_index_value
              (Dwarf_Debug dbg,Dwarf_Unsigned context_index,Dwarf_Unsigned offsetentry_index,
              Dwarf_Unsigned *offset_value_out,Dwarf_Unsigned *global_offset_value_out,
              Dwarf_Error *error)

{
  Dwarf_Byte_Ptr readend;
  Dwarf_Unsigned _ltmp;
  Dwarf_Unsigned targetoffset;
  Dwarf_Small *offsetptr;
  Dwarf_Loclists_Context pDStack_48;
  uint offset_len;
  Dwarf_Loclists_Context con;
  Dwarf_Error *error_local;
  Dwarf_Unsigned *global_offset_value_out_local;
  Dwarf_Unsigned *offset_value_out_local;
  Dwarf_Unsigned offsetentry_index_local;
  Dwarf_Unsigned context_index_local;
  Dwarf_Debug dbg_local;
  
  pDStack_48 = (Dwarf_Loclists_Context)0x0;
  offsetptr._4_4_ = 0;
  targetoffset = 0;
  _ltmp = 0;
  con = (Dwarf_Loclists_Context)error;
  error_local = (Dwarf_Error *)global_offset_value_out;
  global_offset_value_out_local = offset_value_out;
  offset_value_out_local = (Dwarf_Unsigned *)offsetentry_index;
  offsetentry_index_local = context_index;
  context_index_local = (Dwarf_Unsigned)dbg;
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                        "DW_DLE_DBG_NULL: dbg argument to dwarf_get_loclist_offset_index_value()either null or it containsa stale Dwarf_Debug pointer"
                       );
    dbg_local._4_4_ = 1;
  }
  else if (context_index < dbg->de_loclists_context_count) {
    pDStack_48 = dbg->de_loclists_context[context_index];
    if ((pDStack_48 == (Dwarf_Loclists_Context)0x0) || (pDStack_48->lc_magic != 0xadab4)) {
      _dwarf_error_string(dbg,error,0x51,
                          "DW_DLE_DBG_NULLcontext NULL or not LOCLISTS_MAGIC found in dwarf_get_loclist_offset_index_value()"
                         );
      dbg_local._4_4_ = 1;
    }
    else if (offsetentry_index < pDStack_48->lc_offset_entry_count) {
      offsetptr._4_4_ = (uint)pDStack_48->lc_offset_size;
      targetoffset = (Dwarf_Unsigned)
                     (pDStack_48->lc_offsets_array + offsetentry_index * offsetptr._4_4_);
      readend = (Dwarf_Byte_Ptr)0x0;
      if ((Dwarf_Small *)(targetoffset + offsetptr._4_4_) < targetoffset) {
        _dwarf_error_string(dbg,error,0x14b,
                            "DW_DLE_READ_LITTLEENDIAN_ERROR Read starts past the end of section");
        dbg_local._4_4_ = 1;
      }
      else if (pDStack_48->lc_endaddr < (Dwarf_Small *)(targetoffset + offsetptr._4_4_)) {
        _dwarf_error_string(dbg,error,0x14b,
                            "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section")
        ;
        dbg_local._4_4_ = 1;
      }
      else {
        (*dbg->de_copy_word)(&readend,(void *)targetoffset,(ulong)pDStack_48->lc_offset_size);
        if (global_offset_value_out_local != (Dwarf_Unsigned *)0x0) {
          *global_offset_value_out_local = (Dwarf_Unsigned)readend;
        }
        if (error_local != (Dwarf_Error *)0x0) {
          *error_local = (Dwarf_Error)(readend + pDStack_48->lc_offsets_off_in_sect);
        }
        dbg_local._4_4_ = 0;
      }
    }
    else {
      dbg_local._4_4_ = -1;
    }
  }
  else {
    dbg_local._4_4_ = -1;
  }
  return dbg_local._4_4_;
}

Assistant:

int
dwarf_get_loclist_offset_index_value(Dwarf_Debug dbg,
    Dwarf_Unsigned context_index,
    Dwarf_Unsigned offsetentry_index,
    Dwarf_Unsigned * offset_value_out,
    Dwarf_Unsigned * global_offset_value_out,
    Dwarf_Error *error)
{
    Dwarf_Loclists_Context con = 0;
    unsigned offset_len = 0;
    Dwarf_Small *offsetptr = 0;
    Dwarf_Unsigned targetoffset = 0;

    CHECK_DBG(dbg,error,"dwarf_get_loclist_offset_index_value()");
    if (!dbg->de_loclists_context_count) {
    }
    if (context_index >= dbg->de_loclists_context_count) {
        return DW_DLV_NO_ENTRY;
    }
    con = dbg->de_loclists_context[context_index];
    if (!con || con->lc_magic != LOCLISTS_MAGIC) {
        _dwarf_error_string(dbg, error,DW_DLE_DBG_NULL,
            "DW_DLE_DBG_NULL"
            "context NULL or not LOCLISTS_MAGIC "
            "found in "
            "dwarf_get_loclist_offset_index_value()");
        return DW_DLV_ERROR;
    }

    if (offsetentry_index >= con->lc_offset_entry_count) {
        return DW_DLV_NO_ENTRY;
    }
    offset_len = con->lc_offset_size;
    offsetptr = con->lc_offsets_array +
        (offsetentry_index*offset_len);
    READ_UNALIGNED_CK(dbg,targetoffset,Dwarf_Unsigned,
        offsetptr,
        offset_len,error,con->lc_endaddr);
    if (offset_value_out) {
        *offset_value_out = targetoffset;
    }
    if (global_offset_value_out) {
        *global_offset_value_out = targetoffset +
            con->lc_offsets_off_in_sect;
    }
    return DW_DLV_OK;
}